

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pure.cpp
# Opt level: O0

string * fs_root_abi_cxx11_(string *__return_storage_ptr__,string_view path)

{
  path local_70;
  path local_48;
  undefined1 local_20 [8];
  string_view path_local;
  
  path_local._M_len = (size_t)path._M_str;
  local_20 = (undefined1  [8])path._M_len;
  path_local._M_str = (char *)__return_storage_ptr__;
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_70,(basic_string_view<char,_std::char_traits<char>_> *)local_20,auto_format);
  std::filesystem::__cxx11::path::root_path();
  std::filesystem::__cxx11::path::generic_string(__return_storage_ptr__,&local_48);
  std::filesystem::__cxx11::path::~path(&local_48);
  std::filesystem::__cxx11::path::~path(&local_70);
  return __return_storage_ptr__;
}

Assistant:

std::string fs_root(std::string_view path)
{
  // root_path = root_name / root_directory

#ifdef HAVE_CXX_FILESYSTEM
  return std::filesystem::path(path).root_path().generic_string();
#else
  if (std::string r = fs_root_name(path);
       r.empty())
    return fs_slash_first(path) ? "/" : "";
  else
    return (fs_is_windows() && r == path) ? r : r + "/";
#endif
}